

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCases_ExpectTag_Test::TestBody
          (VarintCases_ExpectTag_Test *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ParamType *__src;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_238;
  Message local_230;
  int64_t local_228;
  int local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_2;
  Message local_200;
  int64_t local_1f8;
  unsigned_long local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1b8;
  Message local_1b0;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  uint32_t expected_value;
  Message local_f0;
  uint local_e8 [2];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  uint8_t dummy;
  undefined1 local_c0 [8];
  CodedInputStream coded_input;
  ArrayInputStream input;
  VarintCase *kVarintCases_case;
  VarintCases_ExpectTag_Test *this_local;
  byte local_2d;
  bool local_1d;
  byte local_9;
  
  __src = testing::WithParamInterface<google::protobuf::io::(anonymous_namespace)::VarintCase>::
          GetParam();
  io::(anonymous_namespace)::CodedStreamTest::buffer_ = 0;
  memcpy(&DAT_02ac8171,__src,__src->size);
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&coded_input.extension_factory_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,-1);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_c0,(ZeroCopyInputStream *)&coded_input.extension_factory_);
  CodedInputStream::ReadRaw
            ((CodedInputStream *)local_c0,
             (void *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 3),1);
  local_e8[1] = 0;
  local_e8[0] = (uint)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._3_1_;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_e0,"(uint)\'\\0\'","(uint)dummy",local_e8 + 1,local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff08,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff08);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  uVar2 = (uint)__src->value;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = uVar2;
  if (__src->size < 3) {
    uVar2 = uVar2 + 1;
    if (uVar2 < 0x80) {
      if (((ulong)local_c0 < coded_input.buffer_) && (*(byte *)local_c0 == uVar2)) {
        CodedInputStream::Advance((CodedInputStream *)local_c0,1);
        local_9 = 1;
      }
      else {
        local_9 = 0;
      }
    }
    else if (uVar2 < 0x4000) {
      iVar3 = CodedInputStream::BufferSize((CodedInputStream *)local_c0);
      if (((iVar3 < 2) || ((uint)*(byte *)local_c0 != (uVar2 & 0xff | 0x80))) ||
         ((uint)*(byte *)((long)local_c0 + 1) != (uVar2 >> 7 & 0xff))) {
        local_9 = 0;
      }
      else {
        CodedInputStream::Advance((CodedInputStream *)local_c0,2);
        local_9 = 1;
      }
    }
    else {
      local_9 = 0;
    }
    local_111 = (bool)(~local_9 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_110,&local_111,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_110,
                 (AssertionResult *)"coded_input.ExpectTag(expected_value + 1)","true","false",in_R9
                );
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xd2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    uVar2 = gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_;
    if (gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ < 0x80) {
      if (((ulong)local_c0 < coded_input.buffer_) &&
         (*(byte *)local_c0 ==
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_)) {
        CodedInputStream::Advance((CodedInputStream *)local_c0,1);
        local_1d = true;
      }
      else {
        local_1d = false;
      }
    }
    else if (gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ < 0x4000) {
      iVar3 = CodedInputStream::BufferSize((CodedInputStream *)local_c0);
      if (((iVar3 < 2) || ((uint)*(byte *)local_c0 != (uVar2 & 0xff | 0x80))) ||
         ((uint)*(byte *)((long)local_c0 + 1) != (uVar2 >> 7 & 0xff))) {
        local_1d = false;
      }
      else {
        CodedInputStream::Advance((CodedInputStream *)local_c0,2);
        local_1d = true;
      }
    }
    else {
      local_1d = false;
    }
    local_159 = local_1d;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_158,&local_159,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_158,
                 (AssertionResult *)"coded_input.ExpectTag(expected_value)","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xd3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  }
  else {
    if (uVar2 < 0x80) {
      if (((ulong)local_c0 < coded_input.buffer_) && (*(byte *)local_c0 == uVar2)) {
        CodedInputStream::Advance((CodedInputStream *)local_c0,1);
        local_2d = 1;
      }
      else {
        local_2d = 0;
      }
    }
    else if (uVar2 < 0x4000) {
      iVar3 = CodedInputStream::BufferSize((CodedInputStream *)local_c0);
      if (((iVar3 < 2) || ((uint)*(byte *)local_c0 != (uVar2 & 0xff | 0x80))) ||
         ((uint)*(byte *)((long)local_c0 + 1) != (uVar2 >> 7 & 0xff))) {
        local_2d = 0;
      }
      else {
        CodedInputStream::Advance((CodedInputStream *)local_c0,2);
        local_2d = 1;
      }
    }
    else {
      local_2d = 0;
    }
    local_1a1 = (bool)(~local_2d & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_1a0,
                 (AssertionResult *)"coded_input.ExpectTag(expected_value)","true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xd5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  }
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_c0);
  if (__src->size < 3) {
    local_1f0 = __src->size + 1;
    local_1f8 = ArrayInputStream::ByteCount((ArrayInputStream *)&coded_input.extension_factory_);
    testing::internal::EqHelper::Compare<unsigned_long,_long,_nullptr>
              ((EqHelper *)local_1e8,"kVarintCases_case.size + 1","input.ByteCount()",&local_1f0,
               &local_1f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xda,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_200);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  }
  else {
    local_21c = 1;
    local_228 = ArrayInputStream::ByteCount((ArrayInputStream *)&coded_input.extension_factory_);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_218,"1","input.ByteCount()",&local_21c,&local_228);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
    if (!bVar1) {
      testing::Message::Message(&local_230);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
      testing::internal::AssertHelper::AssertHelper
                (&local_238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xdc,pcVar4);
      testing::internal::AssertHelper::operator=(&local_238,&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_238);
      testing::Message::~Message(&local_230);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  }
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_input.extension_factory_);
  return;
}

Assistant:

TEST_P(VarintCases, ExpectTag) {
  const VarintCase& kVarintCases_case = GetParam();
  // Leave one byte at the beginning of the buffer so we can read it
  // to force the first buffer to be loaded.
  buffer_[0] = '\0';
  memcpy(buffer_ + 1, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_));

  {
    CodedInputStream coded_input(&input);

    // Read one byte to force coded_input.Refill() to be called.  Otherwise,
    // ExpectTag() will return a false negative.
    uint8_t dummy;
    coded_input.ReadRaw(&dummy, 1);
    EXPECT_EQ((uint)'\0', (uint)dummy);

    uint32_t expected_value = static_cast<uint32_t>(kVarintCases_case.value);

    // ExpectTag() produces false negatives for large values.
    if (kVarintCases_case.size <= 2) {
      EXPECT_FALSE(coded_input.ExpectTag(expected_value + 1));
      EXPECT_TRUE(coded_input.ExpectTag(expected_value));
    } else {
      EXPECT_FALSE(coded_input.ExpectTag(expected_value));
    }
  }

  if (kVarintCases_case.size <= 2) {
    EXPECT_EQ(kVarintCases_case.size + 1, input.ByteCount());
  } else {
    EXPECT_EQ(1, input.ByteCount());
  }
}